

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char *fmt;
  OPJ_INT16 *pOVar12;
  uint uVar13;
  long lVar14;
  opj_event_mgr_t *p_event_mgr;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  opj_pi_resolution_t *poVar18;
  opj_pi_comp_t *poVar19;
  uint uVar20;
  bool bVar21;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    uVar11 = (pi->poc).compno0;
    if ((uVar11 < pi->numcomps) && (uVar13 = (pi->poc).compno1, uVar13 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar10 = pi->precno;
        goto LAB_00128dd0;
      }
      pi->first = 0;
      uVar10 = (pi->poc).layno0;
      do {
        pi->layno = uVar10;
        if ((pi->poc).layno1 <= uVar10) {
          return 0;
        }
        uVar10 = (pi->poc).resno0;
        while (pi->resno = uVar10, uVar10 < (pi->poc).resno1) {
          pi->compno = uVar11;
          uVar10 = uVar11;
          while (uVar10 < uVar13) {
            uVar16 = pi->resno;
            if (uVar16 < pi->comps[uVar10].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar18 = pi->comps[uVar10].resolutions;
                (pi->poc).precno1 = poVar18[uVar16].ph * poVar18[uVar16].pw;
              }
              for (uVar10 = (pi->poc).precno0; pi->precno = uVar10, uVar10 < (pi->poc).precno1;
                  uVar10 = uVar10 + 1) {
                uVar16 = pi->step_p * uVar10 +
                         pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar16) goto LAB_00128e8f;
                pOVar12 = pi->include;
                uVar15 = (ulong)uVar16;
                if (pOVar12[uVar15] == 0) {
LAB_00128ea2:
                  pOVar12[uVar15] = 1;
                  return 1;
                }
LAB_00128dd0:
              }
              uVar10 = pi->compno;
            }
            uVar10 = uVar10 + 1;
            pi->compno = uVar10;
          }
          uVar10 = pi->resno + 1;
        }
        uVar10 = pi->layno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_lrcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RLCP:
    uVar11 = (pi->poc).compno0;
    if ((uVar11 < pi->numcomps) && (uVar13 = (pi->poc).compno1, uVar13 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar10 = pi->precno;
        goto LAB_00128f5c;
      }
      pi->first = 0;
      uVar10 = (pi->poc).resno0;
      do {
        pi->resno = uVar10;
        if ((pi->poc).resno1 <= uVar10) {
          return 0;
        }
        uVar10 = (pi->poc).layno0;
        while (pi->layno = uVar10, uVar10 < (pi->poc).layno1) {
          pi->compno = uVar11;
          uVar10 = uVar11;
          while (uVar10 < uVar13) {
            uVar16 = pi->resno;
            if (uVar16 < pi->comps[uVar10].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar18 = pi->comps[uVar10].resolutions;
                (pi->poc).precno1 = poVar18[uVar16].ph * poVar18[uVar16].pw;
              }
              for (uVar10 = (pi->poc).precno0; pi->precno = uVar10, uVar10 < (pi->poc).precno1;
                  uVar10 = uVar10 + 1) {
                uVar16 = pi->step_p * uVar10 +
                         pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar16) goto LAB_00128e8f;
                pOVar12 = pi->include;
                uVar15 = (ulong)uVar16;
                if (pOVar12[uVar15] == 0) goto LAB_00128ea2;
LAB_00128f5c:
              }
              uVar10 = pi->compno;
            }
            uVar10 = uVar10 + 1;
            pi->compno = uVar10;
          }
          uVar10 = pi->layno + 1;
        }
        uVar10 = pi->resno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rlcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RPCL:
    uVar11 = pi->numcomps;
    if (((pi->poc).compno0 < uVar11) && (uVar13 = (pi->poc).compno1, uVar13 < uVar11 + 1)) {
      if (pi->first == 0) {
        uVar11 = pi->layno;
        goto LAB_00128f6d;
      }
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      uVar10 = 0;
      OVar2 = 0;
      for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
        poVar19 = pi->comps + uVar15;
        uVar16 = pi->comps[uVar15].numresolutions;
        uVar17 = (ulong)uVar16;
        for (lVar14 = 0; uVar16 = uVar16 - 1, uVar17 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
          poVar18 = poVar19->resolutions;
          uVar9 = *(int *)((long)&poVar18->pdx + lVar14) + uVar16;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar19->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar9 = poVar19->dx << (bVar6 & 0x1f);
              OVar3 = uVar9;
              if (OVar2 < uVar9) {
                OVar3 = OVar2;
              }
              bVar21 = OVar2 == 0;
              OVar2 = OVar3;
              if (bVar21) {
                OVar2 = uVar9;
              }
              pi->dx = OVar2;
            }
          }
          uVar9 = *(int *)((long)&poVar18->pdy + lVar14) + uVar16;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar19->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar20 = poVar19->dy << (bVar6 & 0x1f);
              uVar9 = uVar20;
              if (uVar10 < uVar20) {
                uVar9 = uVar10;
              }
              bVar21 = uVar10 == 0;
              uVar10 = uVar9;
              if (bVar21) {
                uVar10 = uVar20;
              }
              pi->dy = uVar10;
            }
          }
        }
      }
      if (OVar2 == 0) {
        return 0;
      }
      if (uVar10 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar2 = pi->ty0;
        OVar3 = pi->tx1;
        OVar4 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar3;
        (pi->poc).ty0 = OVar2;
        (pi->poc).ty1 = OVar4;
      }
      uVar11 = (pi->poc).resno0;
      pi->resno = uVar11;
      do {
        if ((pi->poc).resno1 <= uVar11) {
          return 0;
        }
        uVar11 = (pi->poc).ty0;
        while (pi->y = uVar11, uVar11 < (pi->poc).ty1) {
          uVar11 = (pi->poc).tx0;
          while (pi->x = uVar11, uVar11 < (pi->poc).tx1) {
            uVar11 = (pi->poc).compno0;
            while (pi->compno = uVar11, uVar11 < uVar13) {
              uVar13 = pi->resno;
              uVar10 = pi->comps[uVar11].numresolutions;
              if ((uVar13 < uVar10) && (uVar10 = uVar10 + ~uVar13, uVar10 < 0x20)) {
                poVar19 = pi->comps + uVar11;
                bVar6 = (byte)uVar10;
                uVar11 = poVar19->dx << (bVar6 & 0x1f);
                if ((uVar11 >> (bVar6 & 0x1f) == poVar19->dx) &&
                   ((uVar16 = poVar19->dy << (bVar6 & 0x1f), uVar16 >> (bVar6 & 0x1f) == poVar19->dy
                    && (-1 < (int)(uVar16 | uVar11))))) {
                  poVar18 = poVar19->resolutions + uVar13;
                  OVar2 = opj_uint_ceildiv(pi->tx0,uVar11);
                  OVar3 = opj_uint_ceildiv(pi->ty0,poVar19->dy << (bVar6 & 0x1f));
                  OVar4 = opj_uint_ceildiv(pi->tx1,poVar19->dx << (bVar6 & 0x1f));
                  OVar5 = opj_uint_ceildiv(pi->ty1,poVar19->dy << (bVar6 & 0x1f));
                  uVar11 = poVar18->pdx + uVar10;
                  if (uVar11 < 0x1f) {
                    uVar13 = poVar19->dx;
                    bVar7 = (byte)uVar11;
                    if ((uVar13 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                       (uVar10 = poVar18->pdy + uVar10, uVar10 < 0x1f)) {
                      bVar8 = (byte)uVar10;
                      uVar11 = poVar19->dy << (bVar8 & 0x1f);
                      if ((((uVar11 >> (bVar8 & 0x1f) == poVar19->dy) &&
                           (((int)(CONCAT44(0 >> (bVar8 & 0x1f),pi->y) % (ulong)uVar11) == 0 ||
                            ((pi->y == pi->ty0 &&
                             ((OVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                          ((OVar1 = pi->x, OVar1 % (uVar13 << (bVar7 & 0x1f)) == 0 ||
                           ((OVar1 == pi->tx0 &&
                            ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                         ((poVar18->pw != 0 &&
                          (((poVar18->ph != 0 && (OVar2 != OVar4)) && (OVar3 != OVar5)))))) {
                        OVar4 = opj_uint_ceildiv(OVar1,uVar13 << (bVar6 & 0x1f));
                        bVar7 = (byte)poVar18->pdx;
                        OVar5 = opj_uint_ceildiv(pi->y,poVar19->dy << (bVar6 & 0x1f));
                        bVar6 = (byte)poVar18->pdy;
                        pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (OVar3 >> (bVar6 & 0x1f))) *
                                     poVar18->pw +
                                     ((OVar4 >> (bVar7 & 0x1f)) - (OVar2 >> (bVar7 & 0x1f)));
                        for (uVar11 = (pi->poc).layno0; pi->layno = uVar11,
                            uVar11 < (pi->poc).layno1; uVar11 = uVar11 + 1) {
                          uVar13 = pi->step_p * pi->precno +
                                   pi->step_c * pi->compno + pi->step_r * pi->resno +
                                   pi->step_l * uVar11;
                          if (pi->include_size <= uVar13) goto LAB_00128e8f;
                          pOVar12 = pi->include;
                          uVar15 = (ulong)uVar13;
                          if (pOVar12[uVar15] == 0) {
LAB_00129216:
                            pOVar12[uVar15] = 1;
                            return 1;
                          }
LAB_00128f6d:
                        }
                      }
                    }
                  }
                }
              }
              uVar13 = (pi->poc).compno1;
              uVar11 = pi->compno + 1;
            }
            uVar11 = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          uVar11 = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        uVar11 = pi->resno + 1;
        pi->resno = uVar11;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rpcl(): invalid compno0/compno1\n";
    break;
  case OPJ_PCRL:
    uVar11 = pi->numcomps;
    if (((pi->poc).compno0 < uVar11) && (uVar13 = (pi->poc).compno1, uVar13 < uVar11 + 1)) {
      if (pi->first == 0) {
        uVar11 = pi->layno;
        poVar19 = pi->comps + pi->compno;
        goto LAB_001294d6;
      }
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      uVar10 = 0;
      OVar2 = 0;
      for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
        poVar19 = pi->comps + uVar15;
        uVar16 = pi->comps[uVar15].numresolutions;
        uVar17 = (ulong)uVar16;
        for (lVar14 = 0; uVar16 = uVar16 - 1, uVar17 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
          poVar18 = poVar19->resolutions;
          uVar9 = *(int *)((long)&poVar18->pdx + lVar14) + uVar16;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar19->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar9 = poVar19->dx << (bVar6 & 0x1f);
              OVar3 = uVar9;
              if (OVar2 < uVar9) {
                OVar3 = OVar2;
              }
              bVar21 = OVar2 == 0;
              OVar2 = OVar3;
              if (bVar21) {
                OVar2 = uVar9;
              }
              pi->dx = OVar2;
            }
          }
          uVar9 = *(int *)((long)&poVar18->pdy + lVar14) + uVar16;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar19->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar20 = poVar19->dy << (bVar6 & 0x1f);
              uVar9 = uVar20;
              if (uVar10 < uVar20) {
                uVar9 = uVar10;
              }
              bVar21 = uVar10 == 0;
              uVar10 = uVar9;
              if (bVar21) {
                uVar10 = uVar20;
              }
              pi->dy = uVar10;
            }
          }
        }
      }
      if (OVar2 == 0) {
        return 0;
      }
      if (uVar10 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar2 = pi->ty0;
        OVar3 = pi->tx1;
        OVar4 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar3;
        (pi->poc).ty0 = OVar2;
        (pi->poc).ty1 = OVar4;
        uVar11 = pi->ty0;
      }
      else {
        uVar11 = (pi->poc).ty0;
      }
      do {
        pi->y = uVar11;
        if ((pi->poc).ty1 <= uVar11) {
          return 0;
        }
        uVar11 = (pi->poc).tx0;
        while (pi->x = uVar11, uVar11 < (pi->poc).tx1) {
          uVar11 = (pi->poc).compno0;
          while (pi->compno = uVar11, uVar11 < uVar13) {
            poVar19 = pi->comps + uVar11;
            uVar11 = (pi->poc).resno0;
            while( true ) {
              pi->resno = uVar11;
              uVar13 = (pi->poc).resno1;
              uVar10 = poVar19->numresolutions;
              if (uVar10 <= uVar13) {
                uVar13 = uVar10;
              }
              if (uVar13 <= uVar11) break;
              uVar10 = uVar10 + ~uVar11;
              if (uVar10 < 0x20) {
                bVar6 = (byte)uVar10;
                uVar13 = poVar19->dx << (bVar6 & 0x1f);
                if (((uVar13 >> (bVar6 & 0x1f) == poVar19->dx) &&
                    (uVar16 = poVar19->dy << (bVar6 & 0x1f), uVar16 >> (bVar6 & 0x1f) == poVar19->dy
                    )) && (-1 < (int)(uVar16 | uVar13))) {
                  poVar18 = poVar19->resolutions + uVar11;
                  OVar2 = opj_uint_ceildiv(pi->tx0,uVar13);
                  OVar3 = opj_uint_ceildiv(pi->ty0,poVar19->dy << (bVar6 & 0x1f));
                  OVar4 = opj_uint_ceildiv(pi->tx1,poVar19->dx << (bVar6 & 0x1f));
                  OVar5 = opj_uint_ceildiv(pi->ty1,poVar19->dy << (bVar6 & 0x1f));
                  uVar11 = poVar18->pdx + uVar10;
                  if (uVar11 < 0x1f) {
                    uVar13 = poVar19->dx;
                    bVar7 = (byte)uVar11;
                    if ((uVar13 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                       (uVar10 = poVar18->pdy + uVar10, uVar10 < 0x1f)) {
                      bVar8 = (byte)uVar10;
                      uVar11 = poVar19->dy << (bVar8 & 0x1f);
                      if ((((uVar11 >> (bVar8 & 0x1f) == poVar19->dy) &&
                           (((int)(CONCAT44(0 >> (bVar8 & 0x1f),pi->y) % (ulong)uVar11) == 0 ||
                            ((pi->y == pi->ty0 &&
                             ((OVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                          ((OVar1 = pi->x, OVar1 % (uVar13 << (bVar7 & 0x1f)) == 0 ||
                           ((OVar1 == pi->tx0 &&
                            ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                         ((poVar18->pw != 0 &&
                          (((poVar18->ph != 0 && (OVar2 != OVar4)) && (OVar3 != OVar5)))))) {
                        OVar4 = opj_uint_ceildiv(OVar1,uVar13 << (bVar6 & 0x1f));
                        bVar7 = (byte)poVar18->pdx;
                        OVar5 = opj_uint_ceildiv(pi->y,poVar19->dy << (bVar6 & 0x1f));
                        bVar6 = (byte)poVar18->pdy;
                        pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (OVar3 >> (bVar6 & 0x1f))) *
                                     poVar18->pw +
                                     ((OVar4 >> (bVar7 & 0x1f)) - (OVar2 >> (bVar7 & 0x1f)));
                        for (uVar11 = (pi->poc).layno0; pi->layno = uVar11,
                            uVar11 < (pi->poc).layno1; uVar11 = uVar11 + 1) {
                          uVar13 = pi->step_p * pi->precno +
                                   pi->step_c * pi->compno + pi->step_r * pi->resno +
                                   pi->step_l * uVar11;
                          if (pi->include_size <= uVar13) goto LAB_00128e8f;
                          pOVar12 = pi->include;
                          uVar15 = (ulong)uVar13;
                          if (pOVar12[uVar15] == 0) goto LAB_00129216;
LAB_001294d6:
                        }
                      }
                    }
                  }
                }
              }
              uVar11 = pi->resno + 1;
            }
            uVar13 = (pi->poc).compno1;
            uVar11 = pi->compno + 1;
          }
          uVar11 = (pi->x + pi->dx) - pi->x % pi->dx;
        }
        uVar11 = (pi->y + pi->dy) - pi->y % pi->dy;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_pcrl(): invalid compno0/compno1\n";
    break;
  case OPJ_CPRL:
    uVar11 = (pi->poc).compno0;
    if ((uVar11 < pi->numcomps) && (uVar13 = (pi->poc).compno1, uVar13 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar11 = pi->layno;
        poVar19 = pi->comps + pi->compno;
        goto LAB_00129865;
      }
      pi->first = 0;
      do {
        pi->compno = uVar11;
        if (uVar13 <= uVar11) {
          return 0;
        }
        pi->dx = 0;
        pi->dy = 0;
        poVar19 = pi->comps + uVar11;
        uVar11 = pi->comps[uVar11].numresolutions;
        uVar15 = (ulong)uVar11;
        uVar13 = 0;
        OVar2 = 0;
        for (lVar14 = 0; uVar11 = uVar11 - 1, uVar15 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
          poVar18 = poVar19->resolutions;
          uVar10 = *(int *)((long)&poVar18->pdx + lVar14) + uVar11;
          if (uVar10 < 0x20) {
            bVar6 = (byte)uVar10;
            if (poVar19->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar16 = poVar19->dx << (bVar6 & 0x1f);
              uVar10 = uVar16;
              if (OVar2 < uVar16) {
                uVar10 = OVar2;
              }
              bVar21 = OVar2 == 0;
              OVar2 = uVar10;
              if (bVar21) {
                OVar2 = uVar16;
              }
              pi->dx = OVar2;
            }
          }
          uVar10 = *(int *)((long)&poVar18->pdy + lVar14) + uVar11;
          if (uVar10 < 0x20) {
            bVar6 = (byte)uVar10;
            if (poVar19->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar16 = poVar19->dy << (bVar6 & 0x1f);
              uVar10 = uVar16;
              if (uVar13 < uVar16) {
                uVar10 = uVar13;
              }
              bVar21 = uVar13 == 0;
              uVar13 = uVar10;
              if (bVar21) {
                uVar13 = uVar16;
              }
              pi->dy = uVar13;
            }
          }
        }
        if (OVar2 == 0) {
          return 0;
        }
        if (uVar13 == 0) {
          return 0;
        }
        if (pi->tp_on == '\0') {
          OVar2 = pi->ty0;
          OVar3 = pi->tx1;
          OVar4 = pi->ty1;
          (pi->poc).tx0 = pi->tx0;
          (pi->poc).tx1 = OVar3;
          (pi->poc).ty0 = OVar2;
          (pi->poc).ty1 = OVar4;
          uVar11 = pi->ty0;
        }
        else {
          uVar11 = (pi->poc).ty0;
        }
        while (pi->y = uVar11, uVar11 < (pi->poc).ty1) {
          uVar11 = (pi->poc).tx0;
          while (pi->x = uVar11, uVar11 < (pi->poc).tx1) {
            uVar11 = (pi->poc).resno0;
            while( true ) {
              pi->resno = uVar11;
              uVar13 = (pi->poc).resno1;
              uVar10 = poVar19->numresolutions;
              if (uVar10 <= uVar13) {
                uVar13 = uVar10;
              }
              if (uVar13 <= uVar11) break;
              uVar10 = uVar10 + ~uVar11;
              if (uVar10 < 0x20) {
                bVar6 = (byte)uVar10;
                uVar13 = poVar19->dx << (bVar6 & 0x1f);
                if (((uVar13 >> (bVar6 & 0x1f) == poVar19->dx) &&
                    (uVar16 = poVar19->dy << (bVar6 & 0x1f), uVar16 >> (bVar6 & 0x1f) == poVar19->dy
                    )) && (-1 < (int)(uVar16 | uVar13))) {
                  poVar18 = poVar19->resolutions + uVar11;
                  OVar2 = opj_uint_ceildiv(pi->tx0,uVar13);
                  OVar3 = opj_uint_ceildiv(pi->ty0,poVar19->dy << (bVar6 & 0x1f));
                  OVar4 = opj_uint_ceildiv(pi->tx1,poVar19->dx << (bVar6 & 0x1f));
                  OVar5 = opj_uint_ceildiv(pi->ty1,poVar19->dy << (bVar6 & 0x1f));
                  uVar11 = poVar18->pdx + uVar10;
                  if (uVar11 < 0x1f) {
                    uVar13 = poVar19->dx;
                    bVar7 = (byte)uVar11;
                    if ((uVar13 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                       (uVar10 = poVar18->pdy + uVar10, uVar10 < 0x1f)) {
                      bVar8 = (byte)uVar10;
                      uVar11 = poVar19->dy << (bVar8 & 0x1f);
                      if ((((uVar11 >> (bVar8 & 0x1f) == poVar19->dy) &&
                           (((int)(CONCAT44(0 >> (bVar8 & 0x1f),pi->y) % (ulong)uVar11) == 0 ||
                            ((pi->y == pi->ty0 &&
                             ((OVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                          ((OVar1 = pi->x, OVar1 % (uVar13 << (bVar7 & 0x1f)) == 0 ||
                           ((OVar1 == pi->tx0 &&
                            ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                         ((poVar18->pw != 0 &&
                          (((poVar18->ph != 0 && (OVar2 != OVar4)) && (OVar3 != OVar5)))))) {
                        OVar4 = opj_uint_ceildiv(OVar1,uVar13 << (bVar6 & 0x1f));
                        bVar7 = (byte)poVar18->pdx;
                        OVar5 = opj_uint_ceildiv(pi->y,poVar19->dy << (bVar6 & 0x1f));
                        bVar6 = (byte)poVar18->pdy;
                        pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (OVar3 >> (bVar6 & 0x1f))) *
                                     poVar18->pw +
                                     ((OVar4 >> (bVar7 & 0x1f)) - (OVar2 >> (bVar7 & 0x1f)));
                        for (uVar11 = (pi->poc).layno0; pi->layno = uVar11,
                            uVar11 < (pi->poc).layno1; uVar11 = uVar11 + 1) {
                          uVar13 = pi->step_p * pi->precno +
                                   pi->step_c * pi->compno + pi->step_r * pi->resno +
                                   pi->step_l * uVar11;
                          if (pi->include_size <= uVar13) goto LAB_00128e8f;
                          pOVar12 = pi->include;
                          uVar15 = (ulong)uVar13;
                          if (pOVar12[uVar15] == 0) goto LAB_00129216;
LAB_00129865:
                        }
                      }
                    }
                  }
                }
              }
              uVar11 = pi->resno + 1;
            }
            uVar11 = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          uVar11 = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        uVar13 = (pi->poc).compno1;
        uVar11 = pi->compno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_cprl(): invalid compno0/compno1\n";
    break;
  default:
    return 0;
  }
LAB_00128db3:
  opj_event_msg(p_event_mgr,1,fmt);
  return 0;
LAB_00128e8f:
  p_event_mgr = pi->manager;
  fmt = "Invalid access to pi->include";
  goto LAB_00128db3;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}